

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void C_SetAlias(char *name,char *cmd)

{
  char *name_00;
  uint uVar1;
  size_t namelen;
  FConsoleCommand *pFVar2;
  FConsoleAlias *this;
  FConsoleCommand **chain;
  FConsoleCommand *alias;
  FConsoleCommand *prev;
  char *cmd_local;
  char *name_local;
  
  prev = (FConsoleCommand *)cmd;
  cmd_local = name;
  uVar1 = MakeKey(name);
  name_00 = cmd_local;
  pFVar2 = Commands[(ulong)uVar1 % 0xfb];
  namelen = strlen(cmd_local);
  pFVar2 = ScanChainForName(pFVar2,name_00,namelen,&alias);
  if (pFVar2 != (FConsoleCommand *)0x0) {
    uVar1 = (*pFVar2->_vptr_FConsoleCommand[2])();
    if ((uVar1 & 1) == 0) {
      return;
    }
    if (pFVar2 != (FConsoleCommand *)0x0) {
      (*pFVar2->_vptr_FConsoleCommand[1])();
    }
  }
  this = (FConsoleAlias *)operator_new(0x40);
  FConsoleAlias::FConsoleAlias(this,cmd_local,(char *)prev,false);
  return;
}

Assistant:

void C_SetAlias (const char *name, const char *cmd)
{
	FConsoleCommand *prev, *alias, **chain;

	chain = &Commands[MakeKey (name) % FConsoleCommand::HASH_SIZE];
	alias = ScanChainForName (*chain, name, strlen (name), &prev);
	if (alias != NULL)
	{
		if (!alias->IsAlias ())
		{
			//Printf (PRINT_BOLD, "%s is a command and cannot be an alias.\n", name);
			return;
		}
		delete alias;
	}
	new FConsoleAlias (name, cmd, false);
}